

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

void __thiscall testing::Message::Message(Message *this,Message *msg)

{
  void *pvVar1;
  stringstream *this_00;
  long lVar2;
  ostream *poVar3;
  char local_41;
  void *local_40;
  long local_38;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  (this->ss_).ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
  internal::StringStreamToString((internal *)&local_40,(msg->ss_).ptr_);
  pvVar1 = local_40;
  poVar3 = (ostream *)(this_00 + 0x10);
  if (local_40 == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(null)",6);
  }
  else if (local_38 != 0) {
    lVar2 = 0;
    do {
      if (*(char *)((long)pvVar1 + lVar2) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\\0",2);
      }
      else {
        local_41 = *(char *)((long)pvVar1 + lVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_41,1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != local_38);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return;
}

Assistant:

Message(const Message& msg) : ss_(new ::std::stringstream) {  // NOLINT
    *ss_ << msg.GetString();
  }